

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O0

size_t __thiscall
std::hash<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::operator()
          (hash<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *this,
          AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *x)

{
  size_t sVar1;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_RSI;
  AlgConRhs<_1> this_00;
  HashStreamer hs;
  unsigned_long *in_stack_ffffffffffffffb8;
  AlgConRhs<_1> in_stack_ffffffffffffffc0;
  HashStreamerCombine local_20;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *local_10;
  
  local_10 = in_RSI;
  mp::HashStreamerCombine::HashStreamerCombine(&local_20,0);
  mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::GetBody(local_10);
  hash<mp::LinTerms>::operator()((hash<mp::LinTerms> *)this,(LinTerms *)x);
  mp::HashStreamerCombine::Add<unsigned_long>
            ((HashStreamerCombine *)in_stack_ffffffffffffffc0.rhs_,in_stack_ffffffffffffffb8);
  this_00 = mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::GetRhsOrRange(local_10);
  hash<mp::AlgConRhs<-1>_>::operator()
            ((hash<mp::AlgConRhs<_1>_> *)this_00.rhs_,in_stack_ffffffffffffffc0);
  mp::HashStreamerCombine::Add<unsigned_long>
            ((HashStreamerCombine *)in_stack_ffffffffffffffc0.rhs_,(unsigned_long *)this_00.rhs_);
  sVar1 = mp::HashStreamerCombine::FinalizeHashValue(&local_20);
  return sVar1;
}

Assistant:

size_t operator()(
        const mp::AlgebraicConstraint<Body, RangeOrRhs>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(std::hash<RangeOrRhs>{}(x.GetRhsOrRange()));
    return hs.FinalizeHashValue();
  }